

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::InlineReader::EndStep(InlineReader *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *in_RDI;
  ScopedTimer __var2129;
  InlineReader *in_stack_000005b0;
  void *in_stack_fffffffffffffee8;
  ScopedTimer *in_stack_fffffffffffffef0;
  ostream *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff30;
  void *pvVar4;
  int commRank;
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [64];
  
  commRank = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  if (EndStep()::__var129 == '\0') {
    iVar2 = __cxa_guard_acquire(&EndStep()::__var129);
    if (iVar2 != 0) {
      EndStep::__var129 = (void *)ps_timer_create_("InlineReader::EndStep");
      pvVar4 = EndStep::__var129;
      __cxa_guard_release(&EndStep()::__var129);
      commRank = (int)((ulong)pvVar4 >> 0x20);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if ((in_RDI[6].field_2._M_local_buf[0] & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Engine",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"InlineReader",&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"EndStep",&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff48,
               "InlineReader::EndStep() cannot be called without a call to BeginStep() first",
               (allocator *)&stack0xffffffffffffff47);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_RDI,
               commRank);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  if (*(int *)(in_RDI + 6) == 5) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Inline Reader ");
    in_stack_ffffffffffffff00 =
         (ostream *)std::ostream::operator<<(poVar3,*(int *)&in_RDI[6].field_0x4);
    poVar3 = std::operator<<(in_stack_ffffffffffffff00," EndStep() Step ");
    in_stack_fffffffffffffef0 =
         (ScopedTimer *)std::ostream::operator<<(poVar3,in_RDI[6]._M_string_length);
    std::ostream::operator<<(in_stack_fffffffffffffef0,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff00);
  if (!bVar1) {
    SetDeferredVariablePointers(in_stack_000005b0);
  }
  in_RDI[6].field_2._M_local_buf[0] = '\0';
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void InlineReader::EndStep()
{
    PERFSTUBS_SCOPED_TIMER("InlineReader::EndStep");
    if (!m_InsideStep)
    {
        helper::Throw<std::runtime_error>("Engine", "InlineReader", "EndStep",
                                          "InlineReader::EndStep() cannot be called "
                                          "without a call to BeginStep() first");
    }
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Reader " << m_ReaderRank << " EndStep() Step " << m_CurrentStep
                  << std::endl;
    }
    if (!m_DeferredVariables.empty())
    {
        SetDeferredVariablePointers();
    }
    m_InsideStep = false;
}